

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autotune.cc
# Opt level: O2

void __thiscall fasttext::Autotune::printSkippedArgs(Autotune *this,Args *autotuneArgs)

{
  bool bVar1;
  ostream *poVar2;
  long lVar3;
  __node_base *p_Var4;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  argsToCheck;
  undefined1 local_194;
  undefined1 local_193;
  undefined1 local_192;
  allocator<char> local_191;
  allocator<char> local_190;
  allocator<char> local_18f;
  allocator<char> local_18e;
  allocator<char> local_18d;
  allocator<char> local_18c;
  allocator<char> local_18b;
  allocator<char> local_18a;
  allocator<char> local_189;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_188;
  string local_150 [32];
  string local_130 [32];
  string local_110 [32];
  string local_f0 [32];
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  
  std::__cxx11::string::string<std::allocator<char>>(local_150,"epoch",&local_189);
  std::__cxx11::string::string<std::allocator<char>>(local_130,"lr",&local_18a);
  std::__cxx11::string::string<std::allocator<char>>(local_110,"dim",&local_18b);
  std::__cxx11::string::string<std::allocator<char>>(local_f0,"wordNgrams",&local_18c);
  std::__cxx11::string::string<std::allocator<char>>(local_d0,"loss",&local_18d);
  std::__cxx11::string::string<std::allocator<char>>(local_b0,"bucket",&local_18e);
  std::__cxx11::string::string<std::allocator<char>>(local_90,"minn",&local_18f);
  std::__cxx11::string::string<std::allocator<char>>(local_70,"maxn",&local_190);
  std::__cxx11::string::string<std::allocator<char>>(local_50,"dsub",&local_191);
  std::
  _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::_Hashtable<std::__cxx11::string_const*>
            ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)&local_188,local_150,&stack0xffffffffffffffd0,0,&local_192,&local_193,&local_194);
  lVar3 = 0x100;
  do {
    std::__cxx11::string::~string(local_150 + lVar3);
    lVar3 = lVar3 + -0x20;
  } while (lVar3 != -0x20);
  p_Var4 = &local_188._M_before_begin;
  while (p_Var4 = p_Var4->_M_nxt, p_Var4 != (__node_base *)0x0) {
    bVar1 = Args::isManual(autotuneArgs,(string *)(p_Var4 + 1));
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"Warning : ");
      poVar2 = std::operator<<(poVar2,(string *)(p_Var4 + 1));
      poVar2 = std::operator<<(poVar2," is manually set to a specific value. ");
      poVar2 = std::operator<<(poVar2,"It will not be automatically optimized.");
      std::endl<char,std::char_traits<char>>(poVar2);
    }
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_188);
  return;
}

Assistant:

void Autotune::printSkippedArgs(const Args& autotuneArgs) {
  std::unordered_set<std::string> argsToCheck = {"epoch",
                                                 "lr",
                                                 "dim",
                                                 "wordNgrams",
                                                 "loss",
                                                 "bucket",
                                                 "minn",
                                                 "maxn",
                                                 "dsub"};
  for (const auto& arg : argsToCheck) {
    if (autotuneArgs.isManual(arg)) {
      std::cerr << "Warning : " << arg
                << " is manually set to a specific value. "
                << "It will not be automatically optimized." << std::endl;
    }
  }
}